

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdragdrop.cpp
# Opt level: O1

void drop_undo_proc(Am_Object *command)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  ushort uVar3;
  Am_Style old_fill;
  Am_Object self;
  Am_Style new_fill;
  Am_Style local_20 [8];
  Am_Object local_18 [8];
  Am_Style local_10 [8];
  
  uVar3 = (ushort)command;
  pAVar1 = (Am_Value *)Am_Object::Get(uVar3,0x16c);
  Am_Style::Am_Style(local_20,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar3,0x169);
  Am_Style::Am_Style(local_10,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get(uVar3,0x16d);
  Am_Object::Am_Object(local_18,pAVar1);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(local_20);
  Am_Object::Set((ushort)local_18,(Am_Wrapper *)0x6a,(ulong)pAVar2);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(local_10);
  Am_Object::Set(uVar3,(Am_Wrapper *)0x16c,(ulong)pAVar2);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_(local_20);
  Am_Object::Set(uVar3,(Am_Wrapper *)0x169,(ulong)pAVar2);
  Am_Object::~Am_Object(local_18);
  Am_Style::~Am_Style(local_10);
  Am_Style::~Am_Style(local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, drop_undo, (Am_Object command))
{
  Am_Style old_fill = command.Get(Am_OLD_VALUE);
  Am_Style new_fill = command.Get(Am_VALUE);
  Am_Object self = command.Get(Am_OBJECT_MODIFIED);
  self.Set(Am_FILL_STYLE, old_fill);
  command.Set(Am_OLD_VALUE, new_fill);
  command.Set(Am_VALUE, old_fill);
}